

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O3

Fact * __thiscall
r_exec::HLPBindingMap::build_f_ihlp(HLPBindingMap *this,Code *hlp,uint16_t opcode,bool wr_enabled)

{
  ushort uVar1;
  undefined2 uVar2;
  int iVar3;
  _Object *p_Var4;
  int iVar5;
  int iVar6;
  long *plVar7;
  Code *object;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pointer pPVar8;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  Fact *this_00;
  undefined7 in_register_00000009;
  pointer pPVar9;
  uint uVar10;
  Atom *s;
  ulong uVar11;
  uint uVar12;
  uint16_t extent_index;
  Atom local_40 [6];
  ushort local_3a;
  Atom local_38 [4];
  undefined4 local_34;
  
  plVar7 = (long *)r_code::Mem::Get();
  r_code::Atom::Object((ushort)local_38,(uchar)opcode);
  object = (Code *)(**(code **)(*plVar7 + 0x50))(plVar7,local_38);
  r_code::Atom::~Atom(local_38);
  r_code::Atom::RPointer((ushort)local_40);
  iVar5 = (*(object->super__Object)._vptr__Object[4])(object,1);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar5),local_40);
  r_code::Atom::~Atom(local_40);
  (*(object->super__Object)._vptr__Object[0x19])(object,hlp);
  r_code::Atom::IPointer((ushort)local_40);
  iVar5 = (*(object->super__Object)._vptr__Object[4])(object,2);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_00,iVar5),local_40);
  r_code::Atom::~Atom(local_40);
  r_code::Atom::Set((uchar)local_40);
  iVar5 = (*(object->super__Object)._vptr__Object[4])(object,6);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar5),local_40);
  r_code::Atom::~Atom(local_40);
  uVar2 = (this->super_BindingMap).first_index;
  local_3a = uVar2 + 7;
  if (uVar2 != 0) {
    uVar11 = 0;
    do {
      p_Var4 = (this->super_BindingMap).map.
               super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar11].object;
      (*p_Var4->_vptr__Object[3])(p_Var4,object,(ulong)((int)uVar11 + 7U & 0xffff),&local_3a);
      uVar11 = uVar11 + 1;
    } while (uVar11 < (this->super_BindingMap).first_index);
  }
  local_34 = (undefined4)CONCAT71(in_register_00000009,wr_enabled);
  r_code::Atom::IPointer((ushort)local_40);
  iVar5 = (*(object->super__Object)._vptr__Object[4])(object,3);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar5),local_40);
  r_code::Atom::~Atom(local_40);
  uVar1 = (this->super_BindingMap).first_index;
  uVar11 = (ulong)uVar1;
  iVar5 = *(int *)&(this->super_BindingMap).map.
                   super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
  iVar3 = *(int *)&(this->super_BindingMap).map.
                   super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (uint)uVar1;
  r_code::Atom::Set((uchar)local_40);
  iVar6 = (*(object->super__Object)._vptr__Object[4])(object,(ulong)local_3a);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar6),local_40);
  r_code::Atom::~Atom(local_40);
  uVar12 = (uint)local_3a;
  local_3a = (local_3a + ((short)((uint)(iVar5 - iVar3) >> 3) - uVar1)) - 1;
  pPVar8 = (this->super_BindingMap).map.
           super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pPVar9 = (this->super_BindingMap).map.
           super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (uVar11 < (ulong)((long)pPVar9 - (long)pPVar8 >> 3)) {
    uVar12 = uVar12 + 1;
    do {
      if (((uVar10 & 0xffff) != (int)(this->super_BindingMap).fwd_after_index) &&
         ((uVar10 & 0xffff) != (int)(this->super_BindingMap).fwd_before_index)) {
        (*(pPVar8[uVar11].object)->_vptr__Object[3])
                  (pPVar8[uVar11].object,object,(ulong)(uVar12 & 0xffff),&local_3a);
        uVar12 = (uVar12 & 0xffff) + 1;
        pPVar8 = (this->super_BindingMap).map.
                 super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pPVar9 = (this->super_BindingMap).map.
                 super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar10 = uVar10 + 1;
      uVar11 = (ulong)(uVar10 & 0xffff);
    } while (uVar11 < (ulong)((long)pPVar9 - (long)pPVar8 >> 3));
  }
  r_code::Atom::Boolean(SUB81(local_40,0));
  iVar5 = (*(object->super__Object)._vptr__Object[4])(object,4);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar5),local_40);
  r_code::Atom::~Atom(local_40);
  r_code::Atom::Float(1.0);
  iVar5 = (*(object->super__Object)._vptr__Object[4])(object,5);
  s = local_40;
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_05,iVar5),s);
  r_code::Atom::~Atom(local_40);
  this_00 = (Fact *)Fact::operator_new((Fact *)0x150,(size_t)s);
  Fact::Fact(this_00,object,0,0,1.0,1.0);
  local_3a = 6;
  p_Var4 = (this->super_BindingMap).map.
           super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>.
           _M_impl.super__Vector_impl_data._M_start[(this->super_BindingMap).fwd_after_index].object
  ;
  (*p_Var4->_vptr__Object[3])(p_Var4,this_00,2,&local_3a);
  p_Var4 = (this->super_BindingMap).map.
           super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>.
           _M_impl.super__Vector_impl_data._M_start[(this->super_BindingMap).fwd_before_index].
           object;
  (*p_Var4->_vptr__Object[3])(p_Var4,this_00,3,&local_3a);
  return this_00;
}

Assistant:

Fact *HLPBindingMap::build_f_ihlp(Code *hlp, uint16_t opcode, bool wr_enabled) const
{
    Code *ihlp = _Mem::Get()->build_object(Atom::Object(opcode, I_HLP_ARITY));
    ihlp->code(I_HLP_OBJ) = Atom::RPointer(0);
    ihlp->add_reference(hlp);
    uint16_t tpl_arg_index = I_HLP_ARITY + 1;
    ihlp->code(I_HLP_TPL_ARGS) = Atom::IPointer(tpl_arg_index);
    ihlp->code(tpl_arg_index) = Atom::Set(first_index);
    uint16_t write_index = tpl_arg_index + 1;
    uint16_t extent_index = write_index + first_index;

    for (uint16_t i = 0; i < first_index; ++i) { // valuate tpl args.
        map[i]->valuate(ihlp, write_index, extent_index);
        ++write_index;
    }

    ihlp->code(I_HLP_ARGS) = Atom::IPointer(extent_index);
    uint16_t exposed_arg_start = first_index;
    uint16_t exposed_arg_count = map.size() - exposed_arg_start - 2; // -2: do not expose the first after/before timestamps.
    ihlp->code(extent_index) = Atom::Set(exposed_arg_count);
    write_index = extent_index + 1;
    extent_index = write_index + exposed_arg_count;

    for (uint16_t i = exposed_arg_start; i < map.size(); ++i) { // valuate args.
        if (i == fwd_after_index) {
            continue;
        }

        if (i == fwd_before_index) {
            continue;
        }

        map[i]->valuate(ihlp, write_index, extent_index);
        ++write_index;
    }

    ihlp->code(I_HLP_WR_E) = Atom::Boolean(wr_enabled);
    ihlp->code(I_HLP_ARITY) = Atom::Float(1); // psln_thr.
    Fact *f_ihlp = new Fact(ihlp, 0, 0, 1, 1);
    extent_index = FACT_ARITY + 1;
    map[fwd_after_index]->valuate(f_ihlp, FACT_AFTER, extent_index);
    map[fwd_before_index]->valuate(f_ihlp, FACT_BEFORE, extent_index);
    return f_ihlp;
}